

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StegerMatch.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Mat myTemplate;
  Mat myInput;
  Mat saving_image;
  Mat myOutput;
  void *local_388;
  undefined8 uStack_380;
  long local_378;
  _InputArray local_368;
  undefined1 local_350 [16];
  uchar *local_340 [12];
  Mat local_2e0;
  Mat local_280;
  StegerMatch local_1f0;
  Mat local_1b8;
  Mat local_158;
  Mat local_f0;
  Mat local_90;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hello Steger2002 matcher!",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  local_350._0_8_ = (Mat *)local_340;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_350,"C:/Users/hisham/stegerMatch/template.jpg","");
  cv::imread((string *)&local_1b8,(int)local_350);
  if ((Mat *)local_350._0_8_ != (Mat *)local_340) {
    operator_delete((void *)local_350._0_8_,(ulong)(local_340[0] + 1));
  }
  local_158.flags = 300;
  local_158.dims = 0x96;
  local_158.rows = 0x15e;
  local_158.cols = 200;
  cv::Mat::Mat((Mat *)local_350,&local_1b8,(Rect_ *)&local_158);
  cv::Mat::operator=(&local_1b8,(Mat *)local_350);
  cv::Mat::~Mat((Mat *)local_350);
  local_350._0_8_ = (Mat *)local_340;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_350,"C:/Users/hisham/stegerMatch/input.jpg","");
  cv::imread((string *)&local_158,(int)local_350);
  if ((Mat *)local_350._0_8_ != (Mat *)local_340) {
    operator_delete((void *)local_350._0_8_,(ulong)(local_340[0] + 1));
  }
  local_1f0.mTemplateLoaded = false;
  local_1f0.mParameters.mMinRotation = 0.0;
  local_1f0.mParameters.mMaxRotation = 360.0;
  local_1f0.mParameters.mNumRotationSteps = 10.0;
  local_1f0.mParameters.mMinScale = 0.1;
  local_1f0.mParameters.mMaxScale = 2.0;
  local_1f0.mParameters.mNumScaleSteps = 10.0;
  local_1f0.mTemplateSet.
  super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.mTemplateSet.
  super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.mTemplateSet.
  super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  StegerMatch::loadTemplate(&local_1f0,&local_1b8);
  if (local_1f0.mTemplateLoaded == true) {
    cv::Mat::Mat(&local_90);
    StegerMatch::processFrame(&local_1f0,&local_158,&local_90);
    cv::operator*((Mat *)local_350,256.0);
    cv::Mat::Mat(&local_f0);
    (**(code **)(*(long *)local_350._0_8_ + 0x18))(local_350._0_8_,local_350,&local_f0,0xffffffff);
    cv::Mat::~Mat(&local_280);
    cv::Mat::~Mat(&local_2e0);
    cv::Mat::~Mat((Mat *)local_340);
    local_340[0] = (uchar *)0x0;
    local_350._0_4_ = 0x2010000;
    local_350._8_8_ = &local_f0;
    cv::Mat::convertTo((_OutputArray *)&local_f0,(int)local_350,1.0,0.0);
    local_350._0_8_ = (Mat *)local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"output.jpg","");
    local_368.sz.width = 0;
    local_368.sz.height = 0;
    local_368.flags = 0x1010000;
    local_378 = 0;
    local_388 = (void *)0x0;
    uStack_380 = 0;
    local_368.obj = &local_f0;
    cv::imwrite((string *)local_350,&local_368,(vector *)&local_388);
    if (local_388 != (void *)0x0) {
      operator_delete(local_388,local_378 - (long)local_388);
    }
    if ((Mat *)local_350._0_8_ != (Mat *)local_340) {
      operator_delete((void *)local_350._0_8_,(ulong)(local_340[0] + 1));
    }
    local_350._0_8_ = (Mat *)local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"template","");
    local_368.sz.width = 0;
    local_368.sz.height = 0;
    local_368.flags = 0x1010000;
    local_368.obj = &local_1b8;
    cv::imshow((string *)local_350,&local_368);
    if ((Mat *)local_350._0_8_ != (Mat *)local_340) {
      operator_delete((void *)local_350._0_8_,(ulong)(local_340[0] + 1));
    }
    local_350._0_8_ = (Mat *)local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"input","");
    local_368.sz.width = 0;
    local_368.sz.height = 0;
    local_368.flags = 0x1010000;
    local_368.obj = &local_158;
    cv::imshow((string *)local_350,&local_368);
    if ((Mat *)local_350._0_8_ != (Mat *)local_340) {
      operator_delete((void *)local_350._0_8_,(ulong)(local_340[0] + 1));
    }
    local_350._0_8_ = (Mat *)local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"output","");
    local_368.sz.width = 0;
    local_368.sz.height = 0;
    local_368.flags = 0x1010000;
    local_368.obj = &local_90;
    cv::imshow((string *)local_350,&local_368);
    if ((Mat *)local_350._0_8_ != (Mat *)local_340) {
      operator_delete((void *)local_350._0_8_,(ulong)(local_340[0] + 1));
    }
    cv::waitKey(0);
    cv::Mat::~Mat(&local_f0);
    cv::Mat::~Mat(&local_90);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Template was not loaded.",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  std::vector<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>::~vector
            (&local_1f0.mTemplateSet);
  cv::Mat::~Mat(&local_158);
  cv::Mat::~Mat(&local_1b8);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    cout << "Hello Steger2002 matcher!" << endl;
    
    Mat myTemplate = imread("C:/Users/hisham/stegerMatch/template.jpg");
    //create ROI on the template image to only include the object... fill in the right values
	myTemplate = myTemplate(Rect(Point(300, 150), Size(350, 200)));
    
    Mat myInput = imread("C:/Users/hisham/stegerMatch/input.jpg");
	//Mat myInput = imread("C:/Users/hisham/stegerMatch/template2.jpg");
    


    StegerMatch match;	
    match.loadTemplate(myTemplate);
	
    if (match.isTemplateLoaded()) {
        Mat myOutput;
        match.processFrame(myInput, myOutput);
        
		Mat saving_image=myOutput*256;
		saving_image.convertTo(saving_image, CV_8UC1);
		imwrite("output.jpg", saving_image);


        imshow("template",  myTemplate);
        imshow("input",     myInput);
        imshow("output",    myOutput);
        waitKey(0);
    } else {
        cerr << "Template was not loaded." << endl;
    }
	
	
    
    return 0;
}